

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSettingsHandler_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *param_3,char *line)

{
  int iVar1;
  ImGuiDockNodeSettings *pIVar2;
  ImGuiDockNodeSettings *parent_settings;
  ImVec2ih local_60;
  undefined1 local_5c [8];
  ImGuiDockNodeSettings node;
  int r;
  int y;
  int x;
  char c;
  char *line_local;
  void *param_2_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *ctx_local;
  
  y._3_1_ = '\0';
  r = 0;
  node.SizeRef.x = 0;
  node.SizeRef.y = 0;
  node.Size.x = 0;
  node.Size.y = 0;
  _x = line;
  line_local = (char *)param_3;
  param_2_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)ctx;
  ImGuiDockNodeSettings::ImGuiDockNodeSettings((ImGuiDockNodeSettings *)local_5c);
  _x = ImStrSkipBlank(_x);
  iVar1 = strncmp(_x,"DockNode",8);
  if (iVar1 == 0) {
    _x = ImStrSkipBlank(_x + 8);
  }
  else {
    iVar1 = strncmp(_x,"DockSpace",9);
    if (iVar1 != 0) {
      return;
    }
    _x = ImStrSkipBlank(_x + 9);
    node.SelectedTabId = node.SelectedTabId | 0x400;
  }
  iVar1 = __isoc99_sscanf(_x,"ID=0x%08X%n",local_5c,&node.Size);
  if (iVar1 == 1) {
    _x = _x + (int)node.Size;
    iVar1 = __isoc99_sscanf(_x," Parent=0x%08X%n",local_5c + 4,&node.Size);
    if (((iVar1 != 1) || (_x = _x + (int)node.Size, local_5c._4_4_ != 0)) &&
       ((iVar1 = __isoc99_sscanf(_x," Window=0x%08X%n",&node,&node.Size), iVar1 != 1 ||
        (_x = _x + (int)node.Size, node.ID != 0)))) {
      if (local_5c._4_4_ == 0) {
        iVar1 = __isoc99_sscanf(_x," Pos=%i,%i%n",&r,&node.SizeRef,&node.Size);
        if (iVar1 != 2) {
          return;
        }
        _x = _x + (int)node.Size;
        ImVec2ih::ImVec2ih(&local_60,(short)r,node.SizeRef.x);
        node._16_4_ = local_60;
        iVar1 = __isoc99_sscanf(_x," Size=%i,%i%n",&r,&node.SizeRef,&node.Size);
        if (iVar1 != 2) {
          return;
        }
        _x = _x + (int)node.Size;
        ImVec2ih::ImVec2ih((ImVec2ih *)((long)&parent_settings + 4),(short)r,node.SizeRef.x);
        node.Flags = parent_settings._4_4_;
      }
      else {
        iVar1 = __isoc99_sscanf(_x," SizeRef=%i,%i%n",&r,&node.SizeRef,&node.Size);
        if (iVar1 == 2) {
          _x = _x + (int)node.Size;
          ImVec2ih::ImVec2ih((ImVec2ih *)&parent_settings,(short)r,node.SizeRef.x);
          node.Pos = parent_settings._0_4_;
        }
      }
      iVar1 = __isoc99_sscanf(_x," Split=%c%n",(long)&y + 3,&node.Size);
      if (iVar1 == 1) {
        _x = _x + (int)node.Size;
        if (y._3_1_ == 'X') {
          node.ParentWindowId._0_1_ = 0;
        }
        else if (y._3_1_ == 'Y') {
          node.ParentWindowId._0_1_ = 1;
        }
      }
      iVar1 = __isoc99_sscanf(_x," NoResize=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x20;
      }
      iVar1 = __isoc99_sscanf(_x," CentralNode=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x800;
      }
      iVar1 = __isoc99_sscanf(_x," NoTabBar=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x1000;
      }
      iVar1 = __isoc99_sscanf(_x," HiddenTabBar=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x2000;
      }
      iVar1 = __isoc99_sscanf(_x," NoWindowMenuButton=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x4000;
      }
      iVar1 = __isoc99_sscanf(_x," NoCloseButton=%d%n",&r,&node.Size);
      if ((iVar1 == 1) && (_x = _x + (int)node.Size, r != 0)) {
        node.SelectedTabId = node.SelectedTabId | 0x8000;
      }
      iVar1 = __isoc99_sscanf(_x," Selected=0x%08X%n",&node.ParentNodeId,&node.Size);
      if (iVar1 == 1) {
        _x = _x + (int)node.Size;
      }
      if ((local_5c._4_4_ != 0) &&
         (pIVar2 = DockSettingsFindNodeSettings((ImGuiContext *)param_1_local,local_5c._4_4_),
         pIVar2 != (ImGuiDockNodeSettings *)0x0)) {
        node.ParentWindowId._1_1_ = pIVar2->Depth + '\x01';
      }
      ImVector<ImGuiDockNodeSettings>::push_back
                ((ImVector<ImGuiDockNodeSettings> *)&param_1_local[0xb2].ApplyAllFn,
                 (ImGuiDockNodeSettings *)local_5c);
    }
  }
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void*, const char* line)
{
    char c = 0;
    int x = 0, y = 0;
    int r = 0;

    // Parsing, e.g.
    // " DockNode   ID=0x00000001 Pos=383,193 Size=201,322 Split=Y,0.506 "
    // "   DockNode ID=0x00000002 Parent=0x00000001 "
    // Important: this code expect currently fields in a fixed order.
    ImGuiDockNodeSettings node;
    line = ImStrSkipBlank(line);
    if      (strncmp(line, "DockNode", 8) == 0)  { line = ImStrSkipBlank(line + strlen("DockNode")); }
    else if (strncmp(line, "DockSpace", 9) == 0) { line = ImStrSkipBlank(line + strlen("DockSpace")); node.Flags |= ImGuiDockNodeFlags_DockSpace; }
    else return;
    if (sscanf(line, "ID=0x%08X%n",      &node.ID, &r) == 1)            { line += r; } else return;
    if (sscanf(line, " Parent=0x%08X%n", &node.ParentNodeId, &r) == 1)  { line += r; if (node.ParentNodeId == 0) return; }
    if (sscanf(line, " Window=0x%08X%n", &node.ParentWindowId, &r) ==1) { line += r; if (node.ParentWindowId == 0) return; }
    if (node.ParentNodeId == 0)
    {
        if (sscanf(line, " Pos=%i,%i%n",  &x, &y, &r) == 2)         { line += r; node.Pos = ImVec2ih((short)x, (short)y); } else return;
        if (sscanf(line, " Size=%i,%i%n", &x, &y, &r) == 2)         { line += r; node.Size = ImVec2ih((short)x, (short)y); } else return;
    }
    else
    {
        if (sscanf(line, " SizeRef=%i,%i%n", &x, &y, &r) == 2)      { line += r; node.SizeRef = ImVec2ih((short)x, (short)y); }
    }
    if (sscanf(line, " Split=%c%n", &c, &r) == 1)                   { line += r; if (c == 'X') node.SplitAxis = ImGuiAxis_X; else if (c == 'Y') node.SplitAxis = ImGuiAxis_Y; }
    if (sscanf(line, " NoResize=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoResize; }
    if (sscanf(line, " CentralNode=%d%n", &x, &r) == 1)             { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_CentralNode; }
    if (sscanf(line, " NoTabBar=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoTabBar; }
    if (sscanf(line, " HiddenTabBar=%d%n", &x, &r) == 1)            { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_HiddenTabBar; }
    if (sscanf(line, " NoWindowMenuButton=%d%n", &x, &r) == 1)      { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoWindowMenuButton; }
    if (sscanf(line, " NoCloseButton=%d%n", &x, &r) == 1)           { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoCloseButton; }
    if (sscanf(line, " Selected=0x%08X%n", &node.SelectedTabId,&r) == 1) { line += r; }
    if (node.ParentNodeId != 0)
        if (ImGuiDockNodeSettings* parent_settings = DockSettingsFindNodeSettings(ctx, node.ParentNodeId))
            node.Depth = parent_settings->Depth + 1;
    ctx->DockContext.NodesSettings.push_back(node);
}